

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O1

Tensor<std::complex<double>_> * __thiscall
scp::Tensor<std::complex<double>>::operator/=
          (Tensor<std::complex<double>> *this,complex<double> *scalar)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  if (*(long *)(this + 0x18) != 0) {
    puVar1 = *(undefined8 **)(this + 0x20);
    puVar2 = puVar1 + *(long *)(this + 0x18) * 2;
    do {
      uVar4 = puVar1[1];
      uVar3 = __divdc3(*puVar1,uVar4,*(undefined8 *)scalar->_M_value,
                       *(undefined8 *)(scalar->_M_value + 8));
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      puVar1 = puVar1 + 2;
    } while (puVar1 != puVar2);
  }
  return (Tensor<std::complex<double>_> *)this;
}

Assistant:

constexpr Tensor<TValue>& Tensor<TValue>::operator/=(const TScalar& scalar)
	{
		TValue* values = _values;
		const TValue* const valuesEnd = _values + _length;

		for (; values != valuesEnd; ++values)
		{
			*values /= scalar;
		}

		return *this;
	}